

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O3

uint64_t genrand64_int64(void)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  if ((long)mti < 0x138) {
    uVar2 = mt[mti];
    mti = mti + 1;
  }
  else {
    uVar2 = mt[0];
    if (mti == 0x139) {
      mt[0] = 0x1571;
      lVar1 = 1;
      uVar2 = 0;
      uVar4 = 0x1571;
      do {
        uVar4 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d + lVar1;
        mt[lVar1] = uVar4;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x138);
    }
    lVar1 = -0x9c;
    do {
      uVar3 = uVar2 & 0xffffffff80000000;
      uVar2 = mt[lVar1 + 0x9d];
      mt[lVar1 + 0x9c] =
           genrand64_int64::mag01[(uint)uVar2 & 1] ^ *(ulong *)(&_end + lVar1 * 8) ^
           ((uint)uVar2 & 0x7ffffffe | uVar3) >> 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
    lVar1 = 0;
    uVar2 = mt[0x9c];
    do {
      uVar3 = uVar2 & 0xffffffff80000000;
      uVar2 = mt[lVar1 + 0x9d];
      mt[lVar1 + 0x9c] =
           genrand64_int64::mag01[(uint)uVar2 & 1] ^ mt[lVar1] ^
           ((uint)uVar2 & 0x7ffffffe | uVar3) >> 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x9b);
    mt[0x137] = genrand64_int64::mag01[(uint)mt[0] & 1] ^ mt[0x9b] ^
                ((ulong)((uint)mt[0] & 0x7ffffffe) | mt[0x137] & 0xffffffff80000000) >> 1;
    mti = 1;
    uVar2 = mt[0];
  }
  uVar3 = uVar2 >> 0x1d & 0x555555555 ^ uVar2;
  uVar3 = (uVar3 & 0x38eb3ffff6d3) << 0x11 ^ uVar3;
  uVar3 = (ulong)((uint)uVar3 & 0x7ffbf77) << 0x25 ^ uVar3;
  return uVar3 >> 0x2b ^ uVar3;
}

Assistant:

static uint64_t genrand64_int64()
{
    int i;
    uint64_t x;
    static uint64_t mag01[2]={UINT64_C(0), MATRIX_A};

    if (mti >= NN) { /* generate NN words at one time */

        /* if mt_init() has not been called, */
        /* a default initial seed is used     */
        if (mti == NN+1) 
            mt_init(UINT64_C(5489)); 

        for (i=0;i<NN-MM;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+MM] ^ (x>>1) ^ mag01[(int)(x&UINT64_C(1))];
        }
        for (;i<NN-1;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+(MM-NN)] ^ (x>>1) ^ mag01[(int)(x&UINT64_C(1))];
        }
        x = (mt[NN-1]&UM)|(mt[0]&LM);
        mt[NN-1] = mt[MM-1] ^ (x>>1) ^ mag01[(int)(x&UINT64_C(1))];

        mti = 0;
    }
  
    x = mt[mti++];

    x ^= (x >> 29) & UINT64_C(0x5555555555555555);
    x ^= (x << 17) & UINT64_C(0x71D67FFFEDA60000);
    x ^= (x << 37) & UINT64_C(0xFFF7EEE000000000);
    x ^= (x >> 43);

    return x;
}